

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Clear
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,int value)

{
  DictionaryStats *this_00;
  bool bVar1;
  Type *pTVar2;
  bool bVar3;
  undefined1 local_40 [8];
  EditingIterator iter;
  
  local_40 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)local_40;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    bVar1 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)local_40);
    if (!bVar1) {
      return;
    }
    pTVar2 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
             ::Data((Iterator *)local_40);
    bVar1 = false;
  } while (value < pTVar2->value);
  if (pTVar2->value == value) {
    SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
    RemoveCurrent((EditingIterator *)local_40,this->alloc);
    this_00 = this->stats;
    if (this_00 != (DictionaryStats *)0x0) {
      if (bVar3) {
        bVar1 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_40);
        bVar1 = !bVar1;
      }
      else {
        bVar1 = false;
      }
      DictionaryStats::Remove(this_00,bVar1);
    }
  }
  return;
}

Assistant:

void Clear(int value)
    {
        SListBase<Bucket<T>> * list = &this->table[this->Hash(value)];

        // Assumes sorted lists
#if PROFILE_DICTIONARY
        bool first = true;
#endif
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, list, iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                }
                return;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }